

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::SectionInfo::SectionInfo(SectionInfo *this,SourceLineInfo *_lineInfo,string *_name)

{
  string *_name_local;
  SourceLineInfo *_lineInfo_local;
  SectionInfo *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)_name);
  std::__cxx11::string::string((string *)&this->description);
  (this->lineInfo).file = _lineInfo->file;
  (this->lineInfo).line = _lineInfo->line;
  return;
}

Assistant:

SectionInfo::SectionInfo
    (SourceLineInfo const& _lineInfo,
        std::string const& _name)
        : name(_name),
        lineInfo(_lineInfo) {
    }